

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<double_const&>::operator>=
          (result *__return_storage_ptr__,expression_lhs<double_const&> *this,approx *rhs)

{
  lest *this_00;
  bool bVar1;
  approx *in_R8;
  allocator local_d1;
  string local_d0 [32];
  string local_b0;
  string local_90 [32];
  string local_70 [32];
  undefined1 local_50 [40];
  
  bVar1 = lest::operator>=(**(double **)this,rhs);
  this_00 = *(lest **)this;
  std::__cxx11::string::string(local_70,">=",&local_d1);
  std::__cxx11::string::string(local_d0,local_70);
  to_string<double,lest::approx>(&local_b0,this_00,(double *)local_d0,(string *)rhs,in_R8);
  std::__cxx11::string::string(local_90,(string *)&local_b0);
  local_50[0] = bVar1;
  std::__cxx11::string::string((string *)(local_50 + 8),local_90);
  result::result(__return_storage_ptr__,(result *)local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }